

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  DataTable *this;
  DataTableObservable *this_00;
  DataTableObserver *o;
  DataTableObserver *o_00;
  DataTableObserver *numobserver;
  DataTableObserver *hobserver;
  DataTableObservable *observable;
  DataTable *table;
  char **argv_local;
  int argc_local;
  
  this = (DataTable *)operator_new(0x20);
  DataTable::DataTable(this);
  DataTable::append(this,5);
  DataTable::append(this,7);
  DataTable::append(this,9);
  this_00 = (DataTableObservable *)operator_new(0x20);
  DataTableObservable::DataTableObservable(this_00);
  o = (DataTableObserver *)operator_new(0x10);
  HistogramOvserver::HistogramOvserver((HistogramOvserver *)o,this);
  o_00 = (DataTableObserver *)operator_new(0x10);
  NumberObserver::NumberObserver((NumberObserver *)o_00,this);
  DataTableObservable::addObserver(this_00,o);
  DataTableObservable::addObserver(this_00,o_00);
  DataTableObservable::notifyAll(this_00);
  DataTable::set(this,1,2);
  DataTableObservable::notifyAll(this_00);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	DataTable *table = new DataTable();
	table->append(5);
	table->append(7);
	table->append(9);

	DataTableObservable* observable = new DataTableObservable();

	DataTableObserver* hobserver = new HistogramOvserver(table);
	DataTableObserver* numobserver = new NumberObserver(table);

	observable->addObserver(hobserver);
	observable->addObserver(numobserver);

	observable->notifyAll();

	table->set(1, 2);

	observable->notifyAll();

	return 0;
}